

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  byte bVar1;
  lua_State *L;
  StkId pTVar2;
  TValue *io;
  TString *pTVar3;
  TValue *pTVar4;
  char *pcVar5;
  
  L = ls->L;
  pTVar3 = luaS_newlstr(L,str,l);
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if ((pTVar3->tt & 0xe) < 10) {
    (pTVar2->value_).gc = (GCObject *)pTVar3;
    bVar1 = pTVar3->tt;
    pTVar2->tt_ = bVar1 | 0x8000;
    if ((-1 < (char)bVar1) && ((pTVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      pTVar4 = luaH_set(L,ls->h,L->top + -1);
      if (pTVar4->tt_ != 0) {
        if ((pTVar4[1].tt_ & 0xf) == 4) {
          pTVar3 = (TString *)pTVar4[1].value_.gc;
          if ((pTVar3->tt & 0xf) == 4) goto LAB_00142fad;
          pcVar5 = 
          "((((((((const TValue*)((&(((Node *)(((char *)((o))) - __builtin_offsetof(Node, i_val))))->i_key.tvk)))))->value_).gc)->tt) & 0x0F) == 4"
          ;
        }
        else {
          pcVar5 = 
          "((((((((((const TValue*)((&(((Node *)(((char *)((o))) - __builtin_offsetof(Node, i_val))))->i_key.tvk))))))->tt_)) & 0x0F)) == (4))"
          ;
        }
        __assert_fail(pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                      ,0x95,"TString *luaX_newstring(LexState *, const char *, size_t)");
      }
      (pTVar4->value_).b = 1;
      pTVar4->tt_ = 1;
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
LAB_00142fad:
      L->top = L->top + -1;
      return pTVar3;
    }
    pcVar5 = "0";
  }
  else {
    pcVar5 = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,0x8c,"TString *luaX_newstring(LexState *, const char *, size_t)");
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TValue *o;  /* entry for 'str' */
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  setsvalue2s(L, L->top++, ts);  /* temporarily anchor it in stack */
  o = luaH_set(L, ls->h, L->top - 1);
  if (ttisnil(o)) {  /* not in use yet? */
    /* boolean value does not need GC barrier;
       table has no metatable, so it does not need to invalidate cache */
    setbvalue(o, 1);  /* t[string] = true */
    luaC_checkGC(L);
  }
  else {  /* string already present */
    ts = tsvalue(keyfromval(o));  /* re-use value previously stored */
  }
  L->top--;  /* remove string from stack */
  return ts;
}